

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat3 * dja::mat3::rotation(mat3 *__return_storage_ptr__,vec3 *axis,float_t rad)

{
  quaternion local_18;
  
  local_18 = quaternion::rotation(axis,rad);
  rotation(&local_18);
  return __return_storage_ptr__;
}

Assistant:

mat3 mat3::rotation(const vec3& axis, float_t rad)
{
    return rotation(quaternion::rotation(axis, rad));
}